

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.h
# Opt level: O3

void __thiscall entityx::deps::Dependency<A,_B>::assign<B>(Dependency<A,_B> *this,Entity entity)

{
  bool bVar1;
  EntityManager *this_00;
  ulong uVar2;
  ComponentHandle<B,_entityx::EntityManager> CVar3;
  
  CVar3 = EntityManager::component<B,void>(entity.manager_,entity.id_.id_);
  this_00 = CVar3.manager_;
  if (this_00 != (EntityManager *)0x0) {
    uVar2 = CVar3.id_.id_.id_ & 0xffffffff;
    if ((uVar2 < (ulong)(*(long *)(this_00 + 0x68) - *(long *)(this_00 + 0x60) >> 2)) &&
       (*(int *)(*(long *)(this_00 + 0x60) + uVar2 * 4) == CVar3.id_.id_._4_4_)) {
      bVar1 = EntityManager::has_component<B>(this_00,CVar3.id_.id_);
      if (bVar1) {
        return;
      }
    }
  }
  EntityManager::assign<B>(entity.manager_,entity.id_.id_);
  return;
}

Assistant:

void assign(Entity entity) {
    if (!entity.component<D>()) entity.assign<D>();
  }